

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecognitionException.cpp
# Opt level: O2

void __thiscall
antlr::RecognitionException::RecognitionException
          (RecognitionException *this,string *s,string *fileName_,int line_,int column_)

{
  ANTLRException::ANTLRException(&this->super_ANTLRException,s);
  (this->super_ANTLRException)._vptr_ANTLRException =
       (_func_int **)&PTR__RecognitionException_002bc740;
  std::__cxx11::string::string((string *)&this->fileName,(string *)fileName_);
  this->line = line_;
  this->column = column_;
  return;
}

Assistant:

RecognitionException::RecognitionException(const ANTLR_USE_NAMESPACE(std)string& s,
                                           const ANTLR_USE_NAMESPACE(std)string& fileName_,
                                           int line_,int column_)
: ANTLRException(s)
, fileName(fileName_)
, line(line_)
, column(column_)
{
}